

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7b0417::HandleReplaceCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  string_view value;
  string input;
  string local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  cmStringRange local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar2 - (long)pbVar1;
  if (uVar4 < 0x81) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"sub-command REPLACE requires at least four arguments.",
               (allocator<char> *)&local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_28.Begin._M_current = pbVar1 + 4;
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48;
    local_28.End._M_current = pbVar2;
    cmJoin(&local_68,&local_28,(string_view)(auVar3 << 0x40),(string_view)ZEXT816(0));
    std::__cxx11::string::~string((string *)&local_48);
    cmsys::SystemTools::ReplaceString
              (&local_68,pbVar1[1]._M_dataplus._M_p,pbVar1[2]._M_dataplus._M_p);
    value._M_str = local_68._M_dataplus._M_p;
    value._M_len = local_68._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 3,value);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return 0x80 < uVar4;
}

Assistant:

bool HandleReplaceCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 5) {
    status.SetError("sub-command REPLACE requires at least four arguments.");
    return false;
  }

  const std::string& matchExpression = args[1];
  const std::string& replaceExpression = args[2];
  const std::string& variableName = args[3];

  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  cmsys::SystemTools::ReplaceString(input, matchExpression.c_str(),
                                    replaceExpression.c_str());

  status.GetMakefile().AddDefinition(variableName, input);
  return true;
}